

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_61;
  cf_hc_baller *pcStack_60;
  _Bool bdone;
  cf_hc_baller *b;
  ulong uStack_50;
  CURLcode result;
  size_t i;
  cf_hc_baller *ballers [2];
  cf_hc_ctx *ctx;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  b._4_4_ = CURLE_OK;
  if ((cf->field_0x24 & 1) == 0) {
    i = (long)cf->ctx + 0x28;
    ballers[0] = (cf_hc_baller *)((long)cf->ctx + 0x58);
    for (uStack_50 = 0; uStack_50 < 2; uStack_50 = uStack_50 + 1) {
      pcStack_60 = ballers[uStack_50 - 1];
      local_61 = false;
      _Var1 = cf_hc_baller_is_active(pcStack_60);
      if ((_Var1) && (((byte)pcStack_60->field_0x2c >> 1 & 1) == 0)) {
        CVar2 = (*pcStack_60->cf->cft->do_shutdown)(pcStack_60->cf,data,&local_61);
        pcStack_60->result = CVar2;
        if ((pcStack_60->result != CURLE_OK) || ((local_61 & 1U) != 0)) {
          pcStack_60->field_0x2c = pcStack_60->field_0x2c & 0xfd | 2;
        }
      }
    }
    *done = true;
    for (uStack_50 = 0; uStack_50 < 2; uStack_50 = uStack_50 + 1) {
      if ((ballers[uStack_50 - 1] != (cf_hc_baller *)0x0) &&
         (((byte)ballers[uStack_50 - 1]->field_0x2c >> 1 & 1) == 0)) {
        *done = false;
      }
    }
    if ((*done & 1U) != 0) {
      for (uStack_50 = 0; uStack_50 < 2; uStack_50 = uStack_50 + 1) {
        if ((ballers[uStack_50 - 1] != (cf_hc_baller *)0x0) &&
           (ballers[uStack_50 - 1]->result != CURLE_OK)) {
          b._4_4_ = ballers[uStack_50 - 1]->result;
        }
      }
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"shutdown -> %d, done=%d",(ulong)b._4_4_,(ulong)(*done & 1));
    }
    cf_local._4_4_ = b._4_4_;
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct cf_hc_baller *ballers[2];
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  ballers[0] = &ctx->h3_baller;
  ballers[1] = &ctx->h21_baller;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    struct cf_hc_baller *b = ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    if(ballers[i] && !ballers[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
      if(ballers[i] && ballers[i]->result)
        result = ballers[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}